

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Diagonal<Eigen::Matrix<float,16,16,0,16,16>,0>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,16,1,0,16,1>>,Eigen::internal::assign_op<float,float>>
               (Diagonal<Eigen::Matrix<float,_16,_16,_0,_16,_16>,_0> *dst,
               CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_16,_1,_0,_16,_1>_>
               *src,assign_op<float,_float> *func)

{
  SrcEvaluatorType srcEvaluator;
  DstEvaluatorType dstEvaluator;
  Kernel kernel;
  SrcEvaluatorType local_38;
  DstEvaluatorType local_30;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Diagonal<Eigen::Matrix<float,_16,_16,_0,_16,_16>,_0>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_16,_1,_0,_16,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
  local_20;
  
  local_20.m_src = &local_38;
  local_38.m_functor.m_other = (src->m_functor).m_other;
  local_30.m_argImpl.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_16,_16,_0,_16,_16>_>_>.m_d.data =
       (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_16,_16,_0,_16,_16>_>_>)dst->m_matrix;
  local_20.m_dst = &local_30;
  local_20.m_functor = func;
  local_20.m_dstExpr = dst;
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Diagonal<Eigen::Matrix<float,_16,_16,_0,_16,_16>,_0>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_16,_1,_0,_16,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>,_0,_16>
  ::run(&local_20);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}